

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::CloneNonSurrogateCodeUnitsTo
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint i;
  uint index;
  CharSetNode *pCVar3;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    index = 0;
    while( true ) {
      uVar1 = GetCompactLength(this);
      if (uVar1 <= index) break;
      uVar1 = GetCompactCharU(this,index);
      if ((uVar1 & 0xf800) != 0xd800) {
        Set(other,allocator,(Char)uVar1);
      }
      index = index + 1;
    }
  }
  else {
    CharBitvec::CloneFrom(&(other->rep).full.direct,&(this->rep).full.direct);
    pCVar3 = (this->rep).full.root;
    if (pCVar3 != (CharSetNode *)0x0) {
      iVar2 = (*pCVar3->_vptr_CharSetNode[1])(pCVar3,allocator);
      pCVar3 = (CharSetNode *)CONCAT44(extraout_var,iVar2);
      (other->rep).full.root = pCVar3;
      (*pCVar3->_vptr_CharSetNode[3])(pCVar3,allocator,2,0xd800,0xdfff,pCVar3->_vptr_CharSetNode[3])
      ;
      return;
    }
    (other->rep).compact.countPlusOne = 0;
  }
  return;
}

Assistant:

void CharSet<char16>::CloneNonSurrogateCodeUnitsTo(ArenaAllocator* allocator, CharSet<Char>& other)
    {
        if (this->IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                Char c = this->GetCompactChar(i);
                uint uChar = CTU(c);
                if (uChar < 0xD800 || uChar > 0xDFFF)
                {
                    other.Set(allocator, c);
                }
            }
        }
        else
        {
            other.rep.full.direct.CloneFrom(rep.full.direct);
            if (rep.full.root == nullptr)
            {
                other.rep.full.root = nullptr;
            }
            else
            {
                other.rep.full.root = rep.full.root->Clone(allocator);
                other.rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, 0xD800, 0XDFFF);
            }
        }
    }